

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MS5837.h
# Opt level: O0

int ms5837_write_command(MS5837 *pMS5837,uint8_t cmd)

{
  int iVar1;
  uint8_t local_1a;
  uint8_t local_19;
  int sendbuflen;
  uchar sendbuf [1];
  uint8_t cmd_local;
  MS5837 *pMS5837_local;
  
  local_19 = cmd;
  _sendbuflen = pMS5837;
  memset(&local_1a,0,1);
  local_1a = local_19;
  iVar1 = WriteAllI2CBus(&_sendbuflen->I2CBus,&local_1a,1);
  if (iVar1 == 0) {
    if ((_sendbuflen->bSaveRawData != 0) && (_sendbuflen->pfSaveFile != (FILE *)0x0)) {
      fwrite(&local_1a,1,1,(FILE *)_sendbuflen->pfSaveFile);
      fflush((FILE *)_sendbuflen->pfSaveFile);
    }
    pMS5837_local._4_4_ = 0;
  }
  else {
    pMS5837_local._4_4_ = 1;
  }
  return pMS5837_local._4_4_;
}

Assistant:

inline int ms5837_write_command(MS5837* pMS5837, uint8_t cmd)
{
	unsigned char sendbuf[1];
	int sendbuflen = 0;

	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));
	sendbuf[0] = (unsigned char)cmd;
	sendbuflen = 1;

	if (WriteAllI2CBus(&pMS5837->I2CBus, (unsigned char*)sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if ((pMS5837->bSaveRawData)&&(pMS5837->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, pMS5837->pfSaveFile);
		fflush(pMS5837->pfSaveFile);
	}

	return EXIT_SUCCESS;
}